

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time-dependency.t.cpp
# Opt level: O3

ostream * __thiscall
dynamicgraph::TimeDependency<int>::displayDependencies
          (TimeDependency<int> *this,ostream *os,int depth,string *space,string *next1,string *next2
          )

{
  DependencyType DVar1;
  SignalBase<int> *this_00;
  pointer pcVar2;
  char cVar3;
  int iVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  long *plVar6;
  long *plVar7;
  ulong uVar8;
  _List_node_base *p_Var9;
  char *pcVar10;
  _List_node_base *p_Var11;
  string ajout2;
  string ajout;
  long *local_168;
  char *local_160;
  long local_158 [2];
  long *local_148;
  char *local_140;
  long local_138 [2];
  string *local_128;
  long *local_120 [2];
  long local_110 [2];
  long *local_100;
  long local_f8;
  long local_f0;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  long *local_e0 [2];
  long local_d0 [2];
  string local_c0;
  _List_node_base *local_a0;
  string *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  this_00 = this->leader;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  pcVar2 = (space->_M_dataplus)._M_p;
  local_128 = space;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar2,pcVar2 + space->_M_string_length);
  pcVar2 = (next1->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + next1->_M_string_length);
  pcVar2 = (next2->_M_dataplus)._M_p;
  local_98 = next2;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + next2->_M_string_length);
  poVar5 = SignalBase<int>::displayDependencies(this_00,os,depth,&local_c0,&local_50,&local_70);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  DVar1 = this->dependencyType;
  if (DVar1 == TIME_DEPENDENT) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"t=",2);
    iVar4 = (*this->leader->_vptr_SignalBase[2])();
    poVar5 = (ostream *)std::ostream::operator<<(os,*(int *)CONCAT44(extraout_var,iVar4));
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," (/",3);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->periodTime);
    pcVar10 = ") ";
    uVar8 = 2;
  }
  else {
    poVar5 = os;
    if (DVar1 == BOOL_DEPENDENT) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"ready=",6);
      uVar8 = (ulong)this->leader->ready;
      pcVar10 = "FALSE";
      if (uVar8 != 0) {
        pcVar10 = "TRUE";
      }
      uVar8 = uVar8 ^ 5;
    }
    else {
      if (DVar1 != ALWAYS_READY) goto LAB_001199f4;
      pcVar10 = "A";
      uVar8 = 1;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar10,uVar8);
LAB_001199f4:
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  p_Var9 = (this->dependencies).
           super__List_base<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  p_Var11 = (_List_node_base *)&this->dependencies;
  if (p_Var9 != p_Var11) {
    cVar3 = (char)os;
    if (depth == 0) {
      std::ios::widen((char)os->_vptr_basic_ostream[-3] + cVar3);
      std::ostream::put(cVar3);
      poVar5 = (ostream *)std::ostream::flush();
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(local_128->_M_dataplus)._M_p,local_128->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"   `-- ...",10);
    }
    else {
      local_a0 = p_Var11;
      do {
        std::ios::widen((char)os->_vptr_basic_ostream[-3] + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
        local_148 = local_138;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"|","");
        local_168 = local_158;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"|","");
        if (p_Var9->_M_next == p_Var11) {
          std::__cxx11::string::_M_replace((ulong)&local_148,0,local_140,0x11bfed);
          std::__cxx11::string::_M_replace((ulong)&local_168,0,local_160,0x11bff1);
        }
        p_Var11 = p_Var9[1]._M_next;
        std::operator+(&local_90,local_128,local_98);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
        plVar7 = plVar6 + 2;
        if ((long *)*plVar6 == plVar7) {
          local_f0 = *plVar7;
          uStack_e8 = (undefined4)plVar6[3];
          uStack_e4 = *(undefined4 *)((long)plVar6 + 0x1c);
          local_100 = &local_f0;
        }
        else {
          local_f0 = *plVar7;
          local_100 = (long *)*plVar6;
        }
        local_f8 = plVar6[1];
        *plVar6 = (long)plVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        local_120[0] = local_110;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_120,local_148,local_140 + (long)local_148);
        local_e0[0] = local_d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_e0,local_168,local_160 + (long)local_168);
        (**(code **)((long)p_Var11->_M_next + 0x58))
                  (p_Var11,os,depth + -1,&local_100,local_120,(string *)local_e0);
        p_Var11 = local_a0;
        if (local_e0[0] != local_d0) {
          operator_delete(local_e0[0],local_d0[0] + 1);
        }
        if (local_120[0] != local_110) {
          operator_delete(local_120[0],local_110[0] + 1);
        }
        if (local_100 != &local_f0) {
          operator_delete(local_100,local_f0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if (local_168 != local_158) {
          operator_delete(local_168,local_158[0] + 1);
        }
        if (local_148 != local_138) {
          operator_delete(local_148,local_138[0] + 1);
        }
        p_Var9 = p_Var9->_M_next;
      } while (p_Var9 != p_Var11);
    }
  }
  return os;
}

Assistant:

std::ostream &TimeDependency<Time>::displayDependencies(
    std::ostream &os, const int depth, std::string space, std::string next1,
    std::string next2) const {
  leader.SignalBase<Time>::displayDependencies(os, depth, space, next1, next2)
      << " (";
  switch (dependencyType) {
    case ALWAYS_READY:
      os << "A";
      break;
    case BOOL_DEPENDENT:
      os << "ready=" << ((leader.getReady()) ? "TRUE" : "FALSE");
      break;
    case TIME_DEPENDENT:
      os << "t=" << leader.getTime() << " (/" << periodTime << ") ";
      break;
  };
  os << ")";  //<<std::endl;
  {
    const typename Dependencies::const_iterator itend = dependencies.end();
    for (typename Dependencies::const_iterator it = dependencies.begin();
         it != itend; ++it)
      if (depth != 0) {
        os << std::endl;
        std::string ajout = "|";
        std::string ajout2 = "|";
        typename Dependencies::const_iterator it2 = it;
        ++it2;
        if (it2 == dependencies.end()) {
          ajout = "`";
          ajout2 = " ";
        }
        (*it)->displayDependencies(os, depth - 1, space + next2 + "   ", ajout,
                                   ajout2);
      } else {
        os << std::endl << space << "   `-- ...";
        break;
      }
  }
  return os;
}